

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

void __thiscall MinVR::VRDatumInt::~VRDatumInt(VRDatumInt *this)

{
  VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::~VRDatumSpecialized
            ((VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

VRDatumInt(const VRInt inVal) :
    VRDatumSpecialized<VRInt, VRCORETYPE_INT>(inVal) {}